

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O0

void Ivy_ObjDelete(Ivy_Man_t *p,Ivy_Obj_t *pObj,int fFreeTop)

{
  Ivy_Obj_t *pIVar1;
  int iVar2;
  uint uVar3;
  Ivy_Obj_t *pFanout;
  int nRefsOld;
  int fFreeTop_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar2 = Ivy_IsComplement(pObj);
  if (iVar2 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                  ,0x101,"void Ivy_ObjDelete(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  iVar2 = Ivy_ObjRefs(pObj);
  if ((iVar2 != 0) && (fFreeTop != 0)) {
    __assert_fail("Ivy_ObjRefs(pObj) == 0 || !fFreeTop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                  ,0x102,"void Ivy_ObjDelete(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  uVar3 = *(uint *)&pObj->field_0x8 & 0xf;
  p->nObjs[uVar3] = p->nObjs[uVar3] + -1;
  p->nDeleted = p->nDeleted + 1;
  Ivy_ObjDisconnect(p,pObj);
  iVar2 = Ivy_ObjIsPi(pObj);
  if (iVar2 == 0) {
    iVar2 = Ivy_ObjIsPo(pObj);
    if (iVar2 == 0) {
      if ((p->fFanout != 0) && (iVar2 = Ivy_ObjIsBuf(pObj), iVar2 != 0)) {
        Vec_PtrRemove(p->vBufs,pObj);
      }
    }
    else {
      Vec_PtrRemove(p->vPos,pObj);
    }
  }
  else {
    Vec_PtrRemove(p->vPis,pObj);
  }
  if (fFreeTop == 0) {
    iVar2 = pObj->nRefs;
    pIVar1 = pObj->pFanout;
    Ivy_ObjClean(pObj);
    pObj->pFanout = pIVar1;
    pObj->nRefs = iVar2;
  }
  else {
    Vec_PtrWriteEntry(p->vObjs,pObj->Id,(void *)0x0);
    Ivy_ManRecycleMemory(p,pObj);
  }
  return;
}

Assistant:

void Ivy_ObjDelete( Ivy_Man_t * p, Ivy_Obj_t * pObj, int fFreeTop )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjRefs(pObj) == 0 || !fFreeTop );
    // update node counters of the manager
    p->nObjs[pObj->Type]--;
    p->nDeleted++;
    // remove connections
    Ivy_ObjDisconnect( p, pObj );
    // remove PIs/POs from the arrays
    if ( Ivy_ObjIsPi(pObj) )
        Vec_PtrRemove( p->vPis, pObj );
    else if ( Ivy_ObjIsPo(pObj) )
        Vec_PtrRemove( p->vPos, pObj );
    else if ( p->fFanout && Ivy_ObjIsBuf(pObj) )
        Vec_PtrRemove( p->vBufs, pObj );
    // clean and recycle the entry
    if ( fFreeTop )
    {
        // free the node
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
    }
    else
    {
        int nRefsOld = pObj->nRefs;
        Ivy_Obj_t * pFanout = pObj->pFanout;
        Ivy_ObjClean( pObj );
        pObj->pFanout = pFanout;
        pObj->nRefs = nRefsOld;
    }
}